

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_gvec_sdot_idx_b_aarch64(void *vd,void *vn,void *vm,uint32_t desc)

{
  uint uVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  uintptr_t i;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  
  uVar1 = (desc & 0x1f) * 8 + 8;
  uVar6 = (ulong)uVar1;
  uVar7 = (ulong)(uVar1 >> 2);
  iVar8 = (int)desc >> 10;
  uVar9 = 4;
  if (uVar7 < 4) {
    uVar9 = uVar7;
  }
  lVar11 = 0;
  do {
    cVar2 = *(char *)((long)vm + lVar11 * 4 + (long)iVar8 * 4);
    cVar3 = *(char *)((long)vm + lVar11 * 4 + (long)iVar8 * 4 + 1);
    cVar4 = *(char *)((long)vm + lVar11 * 4 + (long)iVar8 * 4 + 2);
    cVar5 = *(char *)((long)vm + lVar11 * 4 + (long)iVar8 * 4 + 3);
    do {
      lVar10 = lVar11;
      *(int *)((long)vd + lVar10 * 4) =
           (int)*(char *)((long)vn + lVar10 * 4 + 2) * (int)cVar4 +
           (int)*(char *)((long)vn + lVar10 * 4 + 1) * (int)cVar3 +
           (int)*(char *)((long)vn + lVar10 * 4) * (int)cVar2 + *(int *)((long)vd + lVar10 * 4) +
           (int)*(char *)((long)vn + lVar10 * 4 + 3) * (int)cVar5;
      lVar11 = lVar10 + 1;
    } while (lVar11 < (long)uVar9);
    uVar9 = lVar10 + 5;
  } while (lVar11 < (long)uVar7);
  for (; uVar6 < (desc >> 2 & 0xf8) + 8; uVar6 = uVar6 + 8) {
    *(undefined8 *)((long)vd + uVar6) = 0;
  }
  return;
}

Assistant:

void HELPER(gvec_sdot_idx_b)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, segend, opr_sz = simd_oprsz(desc), opr_sz_4 = opr_sz / 4;
    intptr_t index = simd_data(desc);
    uint32_t *d = vd;
    int8_t *n = vn;
    int8_t *m_indexed = (int8_t *)vm + index * 4;

    /* Notice the special case of opr_sz == 8, from aa64/aa32 advsimd.
     * Otherwise opr_sz is a multiple of 16.
     */
    segend = MIN(4, opr_sz_4);
    i = 0;
    do {
        int8_t m0 = m_indexed[i * 4 + 0];
        int8_t m1 = m_indexed[i * 4 + 1];
        int8_t m2 = m_indexed[i * 4 + 2];
        int8_t m3 = m_indexed[i * 4 + 3];

        do {
            d[i] += n[i * 4 + 0] * m0
                  + n[i * 4 + 1] * m1
                  + n[i * 4 + 2] * m2
                  + n[i * 4 + 3] * m3;
        } while (++i < segend);
        segend = i + 4;
    } while (i < opr_sz_4);

    clear_tail(d, opr_sz, simd_maxsz(desc));
}